

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

char * GetFileNameWithoutExt(char *filePath)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  
  GetFileNameWithoutExt::fileName[0x70] = '\0';
  GetFileNameWithoutExt::fileName[0x71] = '\0';
  GetFileNameWithoutExt::fileName[0x72] = '\0';
  GetFileNameWithoutExt::fileName[0x73] = '\0';
  GetFileNameWithoutExt::fileName[0x74] = '\0';
  GetFileNameWithoutExt::fileName[0x75] = '\0';
  GetFileNameWithoutExt::fileName[0x76] = '\0';
  GetFileNameWithoutExt::fileName[0x77] = '\0';
  GetFileNameWithoutExt::fileName[0x78] = '\0';
  GetFileNameWithoutExt::fileName[0x79] = '\0';
  GetFileNameWithoutExt::fileName[0x7a] = '\0';
  GetFileNameWithoutExt::fileName[0x7b] = '\0';
  GetFileNameWithoutExt::fileName[0x7c] = '\0';
  GetFileNameWithoutExt::fileName[0x7d] = '\0';
  GetFileNameWithoutExt::fileName[0x7e] = '\0';
  GetFileNameWithoutExt::fileName[0x7f] = '\0';
  GetFileNameWithoutExt::fileName[0x60] = '\0';
  GetFileNameWithoutExt::fileName[0x61] = '\0';
  GetFileNameWithoutExt::fileName[0x62] = '\0';
  GetFileNameWithoutExt::fileName[99] = '\0';
  GetFileNameWithoutExt::fileName[100] = '\0';
  GetFileNameWithoutExt::fileName[0x65] = '\0';
  GetFileNameWithoutExt::fileName[0x66] = '\0';
  GetFileNameWithoutExt::fileName[0x67] = '\0';
  GetFileNameWithoutExt::fileName[0x68] = '\0';
  GetFileNameWithoutExt::fileName[0x69] = '\0';
  GetFileNameWithoutExt::fileName[0x6a] = '\0';
  GetFileNameWithoutExt::fileName[0x6b] = '\0';
  GetFileNameWithoutExt::fileName[0x6c] = '\0';
  GetFileNameWithoutExt::fileName[0x6d] = '\0';
  GetFileNameWithoutExt::fileName[0x6e] = '\0';
  GetFileNameWithoutExt::fileName[0x6f] = '\0';
  GetFileNameWithoutExt::fileName[0x50] = '\0';
  GetFileNameWithoutExt::fileName[0x51] = '\0';
  GetFileNameWithoutExt::fileName[0x52] = '\0';
  GetFileNameWithoutExt::fileName[0x53] = '\0';
  GetFileNameWithoutExt::fileName[0x54] = '\0';
  GetFileNameWithoutExt::fileName[0x55] = '\0';
  GetFileNameWithoutExt::fileName[0x56] = '\0';
  GetFileNameWithoutExt::fileName[0x57] = '\0';
  GetFileNameWithoutExt::fileName[0x58] = '\0';
  GetFileNameWithoutExt::fileName[0x59] = '\0';
  GetFileNameWithoutExt::fileName[0x5a] = '\0';
  GetFileNameWithoutExt::fileName[0x5b] = '\0';
  GetFileNameWithoutExt::fileName[0x5c] = '\0';
  GetFileNameWithoutExt::fileName[0x5d] = '\0';
  GetFileNameWithoutExt::fileName[0x5e] = '\0';
  GetFileNameWithoutExt::fileName[0x5f] = '\0';
  GetFileNameWithoutExt::fileName[0x40] = '\0';
  GetFileNameWithoutExt::fileName[0x41] = '\0';
  GetFileNameWithoutExt::fileName[0x42] = '\0';
  GetFileNameWithoutExt::fileName[0x43] = '\0';
  GetFileNameWithoutExt::fileName[0x44] = '\0';
  GetFileNameWithoutExt::fileName[0x45] = '\0';
  GetFileNameWithoutExt::fileName[0x46] = '\0';
  GetFileNameWithoutExt::fileName[0x47] = '\0';
  GetFileNameWithoutExt::fileName[0x48] = '\0';
  GetFileNameWithoutExt::fileName[0x49] = '\0';
  GetFileNameWithoutExt::fileName[0x4a] = '\0';
  GetFileNameWithoutExt::fileName[0x4b] = '\0';
  GetFileNameWithoutExt::fileName[0x4c] = '\0';
  GetFileNameWithoutExt::fileName[0x4d] = '\0';
  GetFileNameWithoutExt::fileName[0x4e] = '\0';
  GetFileNameWithoutExt::fileName[0x4f] = '\0';
  GetFileNameWithoutExt::fileName[0x30] = '\0';
  GetFileNameWithoutExt::fileName[0x31] = '\0';
  GetFileNameWithoutExt::fileName[0x32] = '\0';
  GetFileNameWithoutExt::fileName[0x33] = '\0';
  GetFileNameWithoutExt::fileName[0x34] = '\0';
  GetFileNameWithoutExt::fileName[0x35] = '\0';
  GetFileNameWithoutExt::fileName[0x36] = '\0';
  GetFileNameWithoutExt::fileName[0x37] = '\0';
  GetFileNameWithoutExt::fileName[0x38] = '\0';
  GetFileNameWithoutExt::fileName[0x39] = '\0';
  GetFileNameWithoutExt::fileName[0x3a] = '\0';
  GetFileNameWithoutExt::fileName[0x3b] = '\0';
  GetFileNameWithoutExt::fileName[0x3c] = '\0';
  GetFileNameWithoutExt::fileName[0x3d] = '\0';
  GetFileNameWithoutExt::fileName[0x3e] = '\0';
  GetFileNameWithoutExt::fileName[0x3f] = '\0';
  GetFileNameWithoutExt::fileName[0x20] = '\0';
  GetFileNameWithoutExt::fileName[0x21] = '\0';
  GetFileNameWithoutExt::fileName[0x22] = '\0';
  GetFileNameWithoutExt::fileName[0x23] = '\0';
  GetFileNameWithoutExt::fileName[0x24] = '\0';
  GetFileNameWithoutExt::fileName[0x25] = '\0';
  GetFileNameWithoutExt::fileName[0x26] = '\0';
  GetFileNameWithoutExt::fileName[0x27] = '\0';
  GetFileNameWithoutExt::fileName[0x28] = '\0';
  GetFileNameWithoutExt::fileName[0x29] = '\0';
  GetFileNameWithoutExt::fileName[0x2a] = '\0';
  GetFileNameWithoutExt::fileName[0x2b] = '\0';
  GetFileNameWithoutExt::fileName[0x2c] = '\0';
  GetFileNameWithoutExt::fileName[0x2d] = '\0';
  GetFileNameWithoutExt::fileName[0x2e] = '\0';
  GetFileNameWithoutExt::fileName[0x2f] = '\0';
  GetFileNameWithoutExt::fileName[0x10] = '\0';
  GetFileNameWithoutExt::fileName[0x11] = '\0';
  GetFileNameWithoutExt::fileName[0x12] = '\0';
  GetFileNameWithoutExt::fileName[0x13] = '\0';
  GetFileNameWithoutExt::fileName[0x14] = '\0';
  GetFileNameWithoutExt::fileName[0x15] = '\0';
  GetFileNameWithoutExt::fileName[0x16] = '\0';
  GetFileNameWithoutExt::fileName[0x17] = '\0';
  GetFileNameWithoutExt::fileName[0x18] = '\0';
  GetFileNameWithoutExt::fileName[0x19] = '\0';
  GetFileNameWithoutExt::fileName[0x1a] = '\0';
  GetFileNameWithoutExt::fileName[0x1b] = '\0';
  GetFileNameWithoutExt::fileName[0x1c] = '\0';
  GetFileNameWithoutExt::fileName[0x1d] = '\0';
  GetFileNameWithoutExt::fileName[0x1e] = '\0';
  GetFileNameWithoutExt::fileName[0x1f] = '\0';
  GetFileNameWithoutExt::fileName[0] = '\0';
  GetFileNameWithoutExt::fileName[1] = '\0';
  GetFileNameWithoutExt::fileName[2] = '\0';
  GetFileNameWithoutExt::fileName[3] = '\0';
  GetFileNameWithoutExt::fileName[4] = '\0';
  GetFileNameWithoutExt::fileName[5] = '\0';
  GetFileNameWithoutExt::fileName[6] = '\0';
  GetFileNameWithoutExt::fileName[7] = '\0';
  GetFileNameWithoutExt::fileName[8] = '\0';
  GetFileNameWithoutExt::fileName[9] = '\0';
  GetFileNameWithoutExt::fileName[10] = '\0';
  GetFileNameWithoutExt::fileName[0xb] = '\0';
  GetFileNameWithoutExt::fileName[0xc] = '\0';
  GetFileNameWithoutExt::fileName[0xd] = '\0';
  GetFileNameWithoutExt::fileName[0xe] = '\0';
  GetFileNameWithoutExt::fileName[0xf] = '\0';
  if (filePath != (char *)0x0) {
    pcVar3 = (char *)0x0;
    pcVar7 = filePath;
    do {
      pcVar2 = pcVar3;
      pcVar3 = strpbrk(pcVar7,"\\/");
      pcVar7 = pcVar3 + 1;
    } while (pcVar3 != (char *)0x0);
    pcVar7 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = filePath;
    }
    strcpy(GetFileNameWithoutExt::fileName,pcVar7);
  }
  sVar4 = strlen(GetFileNameWithoutExt::fileName);
  if (0 < (int)sVar4) {
    uVar1 = (int)sVar4 - 1;
    uVar6 = 0x7f;
    if (uVar1 < 0x7f) {
      uVar6 = uVar1;
    }
    uVar5 = 0;
    do {
      if (GetFileNameWithoutExt::fileName[uVar5] == '.') {
        GetFileNameWithoutExt::fileName[uVar5] = '\0';
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 + 1 != uVar5);
  }
  return GetFileNameWithoutExt::fileName;
}

Assistant:

const char *GetFileNameWithoutExt(const char *filePath)
{
    #define MAX_FILENAMEWITHOUTEXT_LENGTH   128

    static char fileName[MAX_FILENAMEWITHOUTEXT_LENGTH];
    memset(fileName, 0, MAX_FILENAMEWITHOUTEXT_LENGTH);

    if (filePath != NULL) strcpy(fileName, GetFileName(filePath));   // Get filename with extension

    int len = (int)strlen(fileName);

    for (int i = 0; (i < len) && (i < MAX_FILENAMEWITHOUTEXT_LENGTH); i++)
    {
        if (fileName[i] == '.')
        {
            // NOTE: We break on first '.' found
            fileName[i] = '\0';
            break;
        }
    }

    return fileName;
}